

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O1

void __thiscall FListMenuItemPlayerDisplay::UpdateRandomClass(FListMenuItemPlayerDisplay *this)

{
  BYTE *pBVar1;
  FState *pFVar2;
  FPlayerClass *pFVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  iVar6 = this->mRandomTimer;
  this->mRandomTimer = iVar6 + -1;
  if (0 < iVar6) {
    return;
  }
  iVar4 = this->mRandomClass + 1;
  this->mRandomClass = iVar4;
  iVar6 = 0;
  if (iVar4 < (int)PlayerClasses.Count) {
    iVar6 = iVar4;
  }
  this->mRandomClass = iVar6;
  pFVar3 = PlayerClasses.Array;
  this->mPlayerClass = PlayerClasses.Array + iVar6;
  pBVar1 = ((pFVar3[iVar6].Type)->super_PClassActor).super_PClass.Defaults;
  pFVar2 = *(FState **)(pBVar1 + 0x410);
  this->mPlayerState = pFVar2;
  if (pFVar2 == (FState *)0x0) {
    this->mPlayerState = *(FState **)(pBVar1 + 0x408);
  }
  pFVar2 = this->mPlayerState;
  if (pFVar2 == (FState *)0x0) {
    iVar6 = -1;
  }
  else {
    iVar6 = (int)pFVar2->Tics;
    if (pFVar2->TicRange != 0) {
      uVar5 = FRandom::GenRand32(&FState::pr_statetics);
      iVar6 = iVar6 + uVar5 % (pFVar2->TicRange + 1);
    }
  }
  this->mPlayerTics = iVar6;
  this->mRandomTimer = 6;
  UpdateTranslation(this);
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::UpdateRandomClass()
{
	if (--mRandomTimer < 0)
	{
		if (++mRandomClass >= (int)PlayerClasses.Size ()) mRandomClass = 0;
		mPlayerClass = &PlayerClasses[mRandomClass];
		mPlayerState = GetDefaultByType (mPlayerClass->Type)->SeeState;
		if (mPlayerState == NULL)
		{ // No see state, so try spawn state.
			mPlayerState = GetDefaultByType (mPlayerClass->Type)->SpawnState;
		}
		mPlayerTics = mPlayerState != NULL ? mPlayerState->GetTics() : -1;
		mRandomTimer = 6;

		// Since the newly displayed class may used a different translation
		// range than the old one, we need to update the translation, too.
		UpdateTranslation();
	}
}